

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

void __thiscall
crnlib::crnlib_global_initializer::crnlib_global_initializer(crnlib_global_initializer *this)

{
  crn_threading_init();
  crnlib_enable_fail_exceptions(true);
  crnd::crnd_set_memory_callbacks(realloc_func,msize_func,(void *)0x0);
  ryg_dxt::sInitDXT();
  pack_etc1_block_init();
  rg_etc1::pack_etc1_block_init();
  return;
}

Assistant:

crnlib_global_initializer()
        {
            crn_threading_init();

            crnlib_enable_fail_exceptions(true);

            // Redirect crn_decomp.h's memory allocations into crnlib, which may be further redirected by the outside caller.
            crnd::crnd_set_memory_callbacks(realloc_func, msize_func, nullptr);

            ryg_dxt::sInitDXT();

            pack_etc1_block_init();

            rg_etc1::pack_etc1_block_init();
        }